

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int emit_string(nghttp2_bufs *bufs,uint8_t *str,size_t len)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t sb [16];
  byte local_38;
  byte local_37 [23];
  
  sVar3 = nghttp2_hd_huff_encode_count(str,len);
  sVar7 = len;
  if (sVar3 < len) {
    sVar7 = sVar3;
  }
  if (sVar7 < 0x7f) {
    local_38 = (byte)sVar7 | (sVar3 < len) << 7;
    sVar7 = 1;
  }
  else {
    uVar6 = sVar7 - 0x7f;
    if (uVar6 < 0x80) {
      local_38 = (sVar3 < len) << 7 | 0x7f;
      pbVar5 = local_37;
      sVar7 = 2;
    }
    else {
      uVar4 = uVar6;
      uVar9 = 0;
      do {
        uVar8 = uVar9;
        uVar9 = uVar8 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar4 >> 7;
      } while (bVar1);
      if (0xe < uVar9) {
        return -0x20b;
      }
      sVar7 = uVar8 + 3;
      local_38 = (sVar3 < len) << 7 | 0x7f;
      pbVar5 = local_37;
      uVar4 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar5 = (byte)uVar4 | 0x80;
          uVar6 = uVar4 >> 7;
          pbVar5 = pbVar5 + 1;
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar6;
        } while (bVar1);
      }
    }
    *pbVar5 = (byte)uVar6;
  }
  iVar2 = nghttp2_bufs_add(bufs,&local_38,sVar7);
  if (iVar2 == 0) {
    if (sVar3 < len) {
      iVar2 = nghttp2_hd_huff_encode(bufs,str,len);
    }
    else {
      iVar2 = nghttp2_bufs_add(bufs,str,len);
    }
  }
  return iVar2;
}

Assistant:

static int emit_string(nghttp2_bufs *bufs, const uint8_t *str, size_t len) {
  int rv;
  uint8_t sb[16];
  uint8_t *bufp;
  size_t blocklen;
  size_t enclen;
  int huffman = 0;

  enclen = nghttp2_hd_huff_encode_count(str, len);

  if (enclen < len) {
    huffman = 1;
  } else {
    enclen = len;
  }

  blocklen = count_encoded_length(enclen, 7);

  DEBUGF("deflatehd: emit string str=%.*s, length=%zu, huffman=%d, "
         "encoded_length=%zu\n",
         (int)len, (const char *)str, len, huffman, enclen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;
  *bufp = huffman ? 1 << 7 : 0;
  encode_length(bufp, enclen, 7);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  if (huffman) {
    rv = nghttp2_hd_huff_encode(bufs, str, len);
  } else {
    assert(enclen == len);
    rv = nghttp2_bufs_add(bufs, str, len);
  }

  return rv;
}